

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O2

int __thiscall cmCPackArchiveGenerator::GetThreadCount(cmCPackArchiveGenerator *this)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CPACK_ARCHIVE_THREADS",&local_31);
  bVar1 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"CPACK_ARCHIVE_THREADS",&local_31);
    psVar3 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_30);
    if (psVar3 == (string *)0x0) {
      psVar3 = &cmValue::Empty_abi_cxx11_;
    }
    iVar2 = std::__cxx11::stoi(psVar3,(size_t *)0x0,10);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"CPACK_THREADS",&local_31);
    bVar1 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    if (!bVar1) {
      return 1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"CPACK_THREADS",&local_31);
    psVar3 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_30);
    if (psVar3 == (string *)0x0) {
      psVar3 = &cmValue::Empty_abi_cxx11_;
    }
    iVar2 = std::__cxx11::stoi(psVar3,(size_t *)0x0,10);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return iVar2;
}

Assistant:

int cmCPackArchiveGenerator::GetThreadCount() const
{
  int threads = 1;

  // CPACK_ARCHIVE_THREADS overrides CPACK_THREADS
  if (this->IsSet("CPACK_ARCHIVE_THREADS")) {
    threads = std::stoi(this->GetOption("CPACK_ARCHIVE_THREADS"));
  } else if (this->IsSet("CPACK_THREADS")) {
    threads = std::stoi(this->GetOption("CPACK_THREADS"));
  }

  return threads;
}